

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiInApi::~MidiInApi(MidiInApi *this)

{
  MidiMessage *pMVar1;
  double dVar2;
  MidiMessage *this_00;
  MidiInApi *this_local;
  
  (this->super_MidiApi)._vptr_MidiApi = (_func_int **)&PTR__MidiInApi_00126ae0;
  if (((this->inputData_).queue.ringSize != 0) &&
     (pMVar1 = (this->inputData_).queue.ring, pMVar1 != (MidiMessage *)0x0)) {
    dVar2 = pMVar1[-1].timeStamp;
    this_00 = pMVar1 + (long)dVar2;
    while (pMVar1 != this_00) {
      this_00 = this_00 + -1;
      MidiMessage::~MidiMessage(this_00);
    }
    operator_delete__(&pMVar1[-1].timeStamp,(long)dVar2 * 0x20 + 8);
  }
  RtMidiInData::~RtMidiInData(&this->inputData_);
  MidiApi::~MidiApi(&this->super_MidiApi);
  return;
}

Assistant:

MidiInApi :: ~MidiInApi( void )
{
  // Delete the MIDI queue.
  if ( inputData_.queue.ringSize > 0 ) delete [] inputData_.queue.ring;
}